

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_field_base.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::csharp::FieldGeneratorBase::GetStringDefaultValueInternal_abi_cxx11_
          (string *__return_storage_ptr__,FieldGeneratorBase *this,FieldDescriptor *descriptor)

{
  size_t *psVar1;
  _Alloc_hider _Var2;
  char *in_RCX;
  string_view input;
  string local_c0;
  long local_a0;
  char *local_98;
  char local_90 [32];
  undefined8 local_70;
  char *local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  char *local_48;
  long local_40;
  char *local_38;
  undefined8 local_30;
  char *local_28;
  
  psVar1 = *(size_t **)(descriptor + 0x50);
  if (psVar1[1] == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"\"","");
  }
  else {
    input._M_str = in_RCX;
    input._M_len = *psVar1;
    StringToBase64_abi_cxx11_(&local_c0,(csharp *)psVar1[1],input);
    _Var2._M_p = local_c0._M_dataplus._M_p;
    local_a0 = absl::lts_20240722::numbers_internal::FastIntToBuffer
                         (*(ulong *)(*(long *)(descriptor + 0x50) + 8),local_90);
    local_a0 = local_a0 - (long)local_90;
    local_70 = 0x55;
    local_68 = 
    "global::System.Text.Encoding.UTF8.GetString(global::System.Convert.FromBase64String(\"";
    local_60 = local_c0._M_string_length;
    local_58 = _Var2._M_p;
    local_50 = 7;
    local_48 = "\"), 0, ";
    local_30 = 1;
    local_28 = ")";
    local_98 = local_90;
    local_40 = local_a0;
    local_38 = local_90;
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(__return_storage_ptr__,&local_70,5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldGeneratorBase::GetStringDefaultValueInternal(const FieldDescriptor* descriptor) {
    if (descriptor->default_value_string().empty())
        return "\"\"";
    return absl::StrCat(
        "global::System.Text.Encoding.UTF8.GetString(global::System."
        "Convert.FromBase64String(\"",
        StringToBase64(descriptor->default_value_string()), "\"), 0, ",
        descriptor->default_value_string().length(), ")");
}